

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void synthesisSjis(OpenJTalk *oj,char *txt)

{
  char *__ptr;
  char *in_RDI;
  char *txt_utf8;
  
  __ptr = sjistou8((char *)0x197578);
  synthesis((OpenJTalk *)txt_utf8,in_RDI);
  free(__ptr);
  return;
}

Assistant:

void synthesisSjis(OpenJTalk *oj, const char *txt)
{
#if defined(_WIN32)
	if (g_verbose)
	{
		console_message("charset: SJIS\n");
	}
#endif
	char *txt_utf8 = sjistou8(txt);
	synthesis(oj, txt_utf8);
	free(txt_utf8);
}